

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O0

JSONNode * __thiscall JSONNode::operator=(JSONNode *this,JSONNode *orig)

{
  internalJSONNode *piVar1;
  JSONNode *orig_local;
  JSONNode *this_local;
  
  if (this->internal != orig->internal) {
    decRef(this);
    piVar1 = internalJSONNode::incRef(orig->internal);
    this->internal = piVar1;
  }
  return this;
}

Assistant:

inline JSONNode & JSONNode::operator = (const JSONNode & orig) json_nothrow {
    JSON_CHECK_INTERNAL();
    #ifdef JSON_REF_COUNT
	   if (internal == orig.internal) return *this;  //don't want it accidentally deleting itself
    #endif
    decRef();  //dereference my current one
    internal = orig.internal -> incRef();  //increase reference of original
    return *this;
}